

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

int mtbdd_map_contains(MTBDDMAP map,uint32_t key)

{
  uint uVar1;
  
  if (map != 0) {
    do {
      uVar1 = (uint)(*(ulong *)(nodes->data + (map & 0xffffffffff) * 0x10 + 8) >> 0x28);
      if (uVar1 == key) {
        return 1;
      }
    } while ((uVar1 <= key) &&
            (map = map & 0x8000000000000000 |
                   *(ulong *)(nodes->data + (map & 0xffffffffff) * 0x10 + 8) & 0xffffffffff,
            map != 0));
  }
  return 0;
}

Assistant:

int
mtbdd_map_contains(MTBDDMAP map, uint32_t key)
{
    while (!mtbdd_map_isempty(map)) {
        mtbddnode_t n = MTBDD_GETNODE(map);
        uint32_t k = mtbddnode_getvariable(n);
        if (k == key) return 1;
        if (k > key) return 0;
        map = node_getlow(map, n);
    }

    return 0;
}